

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int balance(BtCursor *pCur)

{
  u8 *puVar1;
  void *__dest;
  int *piVar2;
  byte bVar3;
  u8 uVar4;
  ushort uVar5;
  u32 uVar6;
  PgHdr *pPVar7;
  uint uVar8;
  BtShared *pBt;
  MemPage *pMVar9;
  char cVar10;
  u16 uVar11;
  ushort uVar12;
  ushort uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  BtCursor *pBVar17;
  undefined1 *puVar18;
  ulong uVar19;
  ulong extraout_RAX;
  BtShared *pBVar20;
  undefined8 uVar21;
  long lVar22;
  MemPage **ppMVar23;
  uint uVar24;
  int iNew;
  ulong uVar25;
  ulong uVar26;
  MemPage **ppMVar27;
  uint *puVar28;
  u8 *puVar29;
  size_t __n;
  long lVar30;
  MemPage *pMVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  uint uVar35;
  MemPage *pMVar36;
  MemPage **ppMVar37;
  MemPage *pMVar38;
  Pgno PVar39;
  ulong uVar40;
  u8 *puVar41;
  undefined4 *puVar42;
  long in_FS_OFFSET;
  bool bVar43;
  Pgno pgnoNew;
  MemPage *apOld [3];
  int szNew [5];
  u8 abDone [5];
  MemPage *pNew;
  u16 szCell;
  MemPage *pChild;
  Pgno aPgOrder [5];
  u8 *apDiv [2];
  u16 aPgFlags [5];
  Pgno aPgno [5];
  u8 aBalanceQuickSpace [13];
  int local_2bc;
  MemPage **local_2b8;
  uint *local_2b0;
  ulong local_2a8;
  MemPage *local_2a0;
  ulong local_298;
  char local_289;
  BtShared *local_288;
  MemPage **local_280;
  MemPage **local_278;
  uint local_270;
  Pgno local_26c;
  ulong local_268;
  MemPage *local_260;
  ulong local_258;
  undefined8 local_250;
  Pgno local_248;
  uint local_244 [7];
  MemPage *local_228 [3];
  undefined8 uStack_20c;
  int local_204 [5];
  undefined4 local_1f0;
  undefined1 local_1ec;
  MemPage **local_1e8;
  BtCursor *local_1e0;
  void *local_1d8;
  uint local_1cc;
  MemPage **local_1c8;
  void *local_1c0;
  undefined8 local_1b8;
  ulong local_188;
  MemPage **local_180;
  uint *local_178;
  ulong local_170;
  MemPage *local_168 [4];
  undefined1 local_148 [80];
  DbPage *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  CellInfo local_d8;
  MemPage *local_c0;
  ulong local_b8;
  MemPage *local_b0;
  Pgno PStack_a8;
  uint local_a4 [7];
  long alStack_88 [2];
  u16 auStack_72 [5];
  Pgno aPStack_68 [8];
  u8 local_45 [4];
  u8 auStack_41 [9];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c0 = (void *)0x0;
  pMVar31 = pCur->pPage;
  local_1e0 = pCur;
LAB_0014798c:
  if ((pMVar31->nFree < 0) && (iVar14 = btreeComputeFreeSpace(pMVar31), iVar14 != 0)) {
    iVar15 = 0;
  }
  else if (pMVar31->nOverflow == '\0') {
    iVar14 = pMVar31->nFree * 3;
    uVar6 = pCur->pBt->usableSize;
    iVar16 = uVar6 * 2;
    iVar15 = 0;
    if ((iVar14 != iVar16 && SBORROW4(iVar14,iVar16) == (int)(iVar14 + uVar6 * -2) < 0) &&
       (cVar10 = pCur->iPage, cVar10 != '\0')) {
LAB_00147a0f:
      pMVar38 = pCur->apPage[(long)cVar10 + -1];
      uVar12 = pCur->aiIdx[(long)cVar10 + -1];
      iVar15 = sqlite3PagerWrite(pMVar38->pDbPage);
      if ((iVar15 == 0) &&
         ((local_278 = (MemPage **)(ulong)uVar12, -1 < pMVar38->nFree ||
          (iVar15 = btreeComputeFreeSpace(pMVar38), iVar15 == 0)))) {
        local_260 = pMVar38;
        if (((pMVar31->intKeyLeaf != '\0') &&
            (((pMVar31->nOverflow == '\x01' && (pMVar31->aiOvfl[0] == pMVar31->nCell)) &&
             (pMVar38->pgno != 1)))) && (pMVar38->nCell == (u16)local_278)) {
          if (pMVar31->aiOvfl[0] == 0) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12304);
            iVar15 = 0xb;
          }
          else {
            pBVar20 = pMVar31->pBt;
            iVar15 = allocateBtreePage(pBVar20,local_228 + 0xe,&local_248,0,'\0');
            if (iVar15 == 0) {
              local_228[0] = (MemPage *)pMVar31->apOvfl[0];
              local_168[0]._0_2_ = (*pMVar31->xCellSize)(pMVar31,(u8 *)local_228[0]);
              pMVar38 = (MemPage *)CONCAT44(local_1b8._4_4_,(int)local_1b8);
              zeroPage(pMVar38,0xd);
              local_148._0_4_ = 1;
              local_148._16_8_ = local_228;
              local_148._24_8_ = local_168;
              local_148._32_8_ = pMVar31->aDataEnd;
              local_f8 = (DbPage *)CONCAT44(local_f8._4_4_,2);
              local_148._8_8_ = pMVar31;
              iVar15 = rebuildPage((CellArray *)(local_168 + 4),0,1,pMVar38);
              local_d8.nKey._0_4_ = iVar15;
              if (iVar15 == 0) {
                pMVar38->nFree =
                     (pBVar20->usableSize - ((uint)(ushort)local_168[0] + (uint)pMVar38->cellOffset)
                     ) + -2;
                if ((pBVar20->autoVacuum != '\0') &&
                   (ptrmapPut(pBVar20,local_248,'\x05',local_260->pgno,(int *)&local_d8),
                   pMVar38->minLocal < (ushort)local_168[0])) {
                  ptrmapPutOvflPtr(pMVar38,pMVar38,&local_228[0]->isInit,(int *)&local_d8);
                }
                uVar40 = (ulong)(CONCAT11(pMVar31->aCellIdx[(ulong)pMVar31->nCell * 2 + -2],
                                          pMVar31->aCellIdx[(ulong)pMVar31->nCell * 2 + -1]) &
                                pMVar31->maskPage);
                uVar34 = 0;
                puVar29 = pMVar31->aData + uVar40;
                pMVar9 = (MemPage *)(pMVar31->aData + uVar40 + 2);
                do {
                  pMVar36 = pMVar9;
                  puVar41 = puVar29;
                  if (7 < uVar34) break;
                  uVar34 = uVar34 + 1;
                  puVar29 = puVar41 + 1;
                  pMVar9 = (MemPage *)&pMVar36->intKey;
                } while ((char)*puVar41 < '\0');
                lVar22 = 4;
                do {
                  local_228[0] = pMVar36;
                  uVar4 = *(u8 *)((long)&local_228[0][-1].xParseCell + 7);
                  local_45[lVar22] = uVar4;
                  lVar22 = lVar22 + 1;
                  if (-1 < (char)uVar4) break;
                  pMVar36 = (MemPage *)&local_228[0]->intKey;
                } while (local_228[0] < (MemPage *)(puVar41 + 10));
                if ((int)local_d8.nKey == 0) {
                  insertCell(local_260,(uint)local_260->nCell,local_45,(int)lVar22,(u8 *)0x0,
                             pMVar31->pgno,(int *)&local_d8);
                }
                *(Pgno *)(local_260->aData + (ulong)local_260->hdrOffset + 8) =
                     local_248 >> 0x18 | (local_248 & 0xff0000) >> 8 | (local_248 & 0xff00) << 8 |
                     local_248 << 0x18;
                iVar15 = (int)local_d8.nKey;
                if (pMVar38 != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pMVar38->pDbPage);
                  iVar15 = (int)local_d8.nKey;
                }
              }
              else if (pMVar38 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar38->pDbPage);
              }
            }
          }
          goto LAB_001488b2;
        }
        local_1d8 = pcache1Alloc(pCur->pBt->pageSize);
        local_1f0 = 0;
        local_1ec = 0;
        local_148._0_8_ = (MemPage *)0x0;
        local_148._8_8_ = (MemPage *)0x0;
        local_148._16_8_ = (MemPage **)0x0;
        local_148._24_8_ = (MemPage **)0x0;
        local_148._32_8_ = (u8 *)0x0;
        local_148._40_8_ = 0;
        local_148._48_8_ = 0;
        local_148._56_8_ = 0;
        local_148._64_8_ = 0;
        local_148._72_8_ = 0;
        local_f8 = (DbPage *)0x0;
        uStack_f0 = 0;
        local_e8 = 0;
        if (local_1d8 != (void *)0x0) {
          uVar32 = pCur->hints & 1;
          local_b8 = (ulong)uVar32;
          uVar35 = (uint)pMVar38->nCell + (uint)pMVar38->nOverflow;
          local_258 = 0;
          if (1 < uVar35) {
            uVar24 = (uint)local_278;
            if (uVar24 == 0) {
              local_258 = 0;
            }
            else {
              if (uVar35 == uVar24) {
                uVar24 = (uVar24 + uVar32) - 2;
              }
              else {
                uVar24 = uVar24 - 1;
              }
              local_258 = (ulong)uVar24;
            }
            uVar35 = 2 - uVar32;
          }
          local_1e8 = (MemPage **)(ulong)uVar35;
          uVar32 = ((int)local_258 - (uint)pMVar38->nOverflow) + uVar35;
          if (uVar32 == pMVar38->nCell) {
            uVar40 = (ulong)pMVar38->hdrOffset + 8;
          }
          else {
            uVar40 = (ulong)(CONCAT11(pMVar38->aCellIdx[(long)(int)uVar32 * 2],
                                      pMVar38->aCellIdx[(long)(int)uVar32 * 2 + 1]) &
                            pMVar38->maskPage);
          }
          local_178 = (uint *)(pMVar38->aData + uVar40);
          local_288 = pMVar38->pBt;
          local_270 = uVar35 + 1;
          uVar32 = *local_178;
          PVar39 = uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                   uVar32 << 0x18;
          __n = (size_t)(uVar35 * 8);
          local_2a8 = (long)(int)local_258 - 1;
          local_298 = 0;
          ppMVar23 = local_1e8;
          local_289 = cVar10;
          local_180 = local_1e8;
          local_c0 = pMVar31;
          do {
            iVar15 = getAndInitPage(local_288,PVar39,(MemPage **)((long)local_228 + __n),
                                    (BtCursor *)0x0,0);
            ppMVar27 = ppMVar23;
            local_2bc = iVar15;
            if (iVar15 != 0) break;
            pMVar31 = local_228[(long)ppMVar23];
            if ((pMVar31->nFree < 0) &&
               (iVar15 = btreeComputeFreeSpace(pMVar31), local_2bc = iVar15, iVar15 != 0))
            goto LAB_00147fdf;
            iVar14 = (int)local_298 + (uint)pMVar31->nCell;
            uVar40 = (ulong)(iVar14 + 4);
            ppMVar27 = (MemPage **)((long)ppMVar23 + -1);
            if (ppMVar23 == (MemPage **)0x0) {
              uVar32 = iVar14 + 7;
              uVar35 = uVar32 & 0x7ffffffc;
              local_26c = PVar39;
              local_148._16_8_ = sqlite3Malloc((long)(int)(uVar35 * 10 + local_288->pageSize));
              if ((MemPage **)local_148._16_8_ == (MemPage **)0x0) {
                iVar15 = 7;
                uVar32 = 0;
                goto LAB_00148831;
              }
              ppMVar23 = (MemPage **)(local_148._16_8_ + ((ulong)uVar35 * 4 + -0xe) * 2 + 0x1c);
              local_148._24_8_ = ppMVar23;
              local_170 = (long)ppMVar23 + ((ulong)uVar35 - 0xe) * 2 + 0x1c;
              local_148._8_8_ = local_228[0];
              local_1cc = (uint)local_228[0]->leaf;
              local_1c8 = (MemPage **)((ulong)local_228[0]->leaf << 2);
              local_b0 = local_228[0];
              local_298 = (ulong)local_228[0]->intKeyLeaf;
              local_2b0 = (uint *)(ulong)local_270;
              local_188 = local_148._16_8_ +
                          ((ulong)(uVar32 >> 2 & 0x1fffffff) * 0x14 + -0xe) * 2 + 0x1c;
              ppMVar27 = (MemPage **)0x0;
              uVar40 = 0;
              iVar14 = 0;
              local_2a0 = (MemPage *)CONCAT44(local_2a0._4_4_,PVar39);
              local_280 = (MemPage **)local_148._16_8_;
              local_250 = ppMVar23;
              goto LAB_001480b1;
            }
            local_298 = uVar40;
            if (pMVar38->nOverflow == 0) {
              iVar14 = (int)ppMVar23 + (int)local_2a8;
LAB_00147ee2:
              puVar41 = pMVar38->aData;
              lVar22 = (long)(int)(iVar14 - (uint)pMVar38->nOverflow);
              uVar12 = CONCAT11(pMVar38->aCellIdx[lVar22 * 2],pMVar38->aCellIdx[lVar22 * 2 + 1]) &
                       pMVar38->maskPage;
              puVar29 = puVar41 + uVar12;
              alStack_88[(long)ppMVar27] = (long)puVar29;
              local_2a0 = (MemPage *)CONCAT44(local_2a0._4_4_,*(undefined4 *)(puVar41 + uVar12));
              uVar11 = (*pMVar38->xCellSize)(pMVar38,puVar29);
              *(uint *)((long)local_228 + (long)ppMVar23 * 4 + 0x1c) = (uint)uVar11;
              if (((local_288->btsFlags & 0xc) != 0) &&
                 (iVar16 = (int)puVar29 - *(int *)&pMVar38->aData,
                 (int)(iVar16 + (uint)uVar11) <= (int)local_288->usableSize)) {
                memcpy((void *)((long)local_1d8 + (long)iVar16),puVar29,(ulong)(uint)uVar11);
                alStack_88[(long)ppMVar27] =
                     (long)local_1d8 + ((long)puVar29 - (long)pMVar38->aData);
              }
              PVar39 = (uint)local_2a0 >> 0x18 | ((uint)local_2a0 & 0xff0000) >> 8 |
                       ((uint)local_2a0 & 0xff00) << 8 | (uint)local_2a0 << 0x18;
              dropCell(pMVar38,iVar14 - (uint)pMVar38->nOverflow,(uint)uVar11,&local_2bc);
              iVar15 = local_2bc;
            }
            else {
              if ((int)ppMVar23 + (int)local_2a8 != (uint)pMVar38->aiOvfl[0]) {
                iVar14 = (int)local_258 + (int)ppMVar27;
                goto LAB_00147ee2;
              }
              puVar28 = (uint *)pMVar38->apOvfl[0];
              alStack_88[(long)ppMVar27] = (long)puVar28;
              uVar32 = *puVar28;
              PVar39 = uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                       uVar32 << 0x18;
              uVar11 = (*pMVar38->xCellSize)(pMVar38,(u8 *)puVar28);
              *(uint *)((long)local_228 + (long)ppMVar23 * 4 + 0x1c) = (uint)uVar11;
              pMVar38->nOverflow = '\0';
              iVar15 = 0;
            }
            __n = __n - 8;
            ppMVar23 = ppMVar27;
          } while (iVar15 == 0);
          __n = ((long)ppMVar27 << 0x20) + 0x100000000 >> 0x1d;
LAB_00147fdf:
          memset(local_228,0,__n);
          uVar32 = 0;
          goto LAB_0014881f;
        }
        iVar15 = 7;
        goto LAB_00148890;
      }
      goto LAB_001488b2;
    }
  }
  else {
    cVar10 = pCur->iPage;
    if (cVar10 != '\0') goto LAB_00147a0f;
    for (pBVar17 = pCur->pBt->pCursor; pBVar17 != (BtCursor *)0x0; pBVar17 = pBVar17->pNext) {
      if (((pBVar17 != pCur) && (pBVar17->eState == '\0')) && (pBVar17->pPage == pCur->pPage)) {
        iVar15 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12745,
                    "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
        goto LAB_001493cf;
      }
    }
    local_148._0_8_ = (MemPage *)0x0;
    local_228[0] = (MemPage *)((ulong)local_228[0] & 0xffffffff00000000);
    pBVar20 = pMVar31->pBt;
    iVar15 = sqlite3PagerWrite(pMVar31->pDbPage);
    if (iVar15 == 0) {
      local_1b8._0_4_ =
           allocateBtreePage(pBVar20,local_168 + 4,(Pgno *)local_228,pMVar31->pgno,'\0');
      pMVar38 = (MemPage *)local_148._0_8_;
      copyNodeContent(pMVar31,(MemPage *)local_148._0_8_,(int *)(local_228 + 0xe));
      if (pBVar20->autoVacuum != '\0') {
        ptrmapPut(pBVar20,(Pgno)local_228[0],'\x05',pMVar31->pgno,(int *)(local_228 + 0xe));
      }
      iVar15 = (int)local_1b8;
      if ((int)local_1b8 == 0) {
        memcpy((u16 *)((long)pMVar38 + 0x1c),pMVar31->aiOvfl,(ulong)((uint)pMVar31->nOverflow * 2));
        memcpy((u8 **)((long)pMVar38 + 0x28),pMVar31->apOvfl,(ulong)pMVar31->nOverflow << 3);
        *(u8 *)((long)pMVar38 + 0xc) = pMVar31->nOverflow;
        zeroPage(pMVar31,**(u8 **)((long)pMVar38 + 0x50) & 0xfffffff7);
        *(Pgno *)(pMVar31->aData + (ulong)pMVar31->hdrOffset + 8) =
             (Pgno)local_228[0] >> 0x18 | ((Pgno)local_228[0] & 0xff0000) >> 8 |
             ((Pgno)local_228[0] & 0xff00) << 8 | (Pgno)local_228[0] << 0x18;
        local_1e0->apPage[1] = pMVar38;
        local_1e0->iPage = '\x01';
        local_1e0->ix = 0;
        local_1e0->aiIdx[0] = 0;
        local_1e0->apPage[0] = pMVar31;
        iVar15 = 0;
        pCur = local_1e0;
        goto LAB_001488d6;
      }
      local_1e0->apPage[1] = (MemPage *)0x0;
      if (pMVar38 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)((long)pMVar38 + 0x70));
      }
    }
    else {
      local_1e0->apPage[1] = (MemPage *)0x0;
    }
  }
  goto LAB_001493cf;
  while( true ) {
    uVar13 = pMVar31->cellOffset;
    uVar5 = pMVar31->nCell;
    if (puVar41 < puVar29 + (ulong)uVar5 * 2 + (ulong)uVar13) {
      lVar22 = (long)iVar14;
      lVar30 = 0;
      do {
        puVar1 = puVar41 + lVar30;
        *(u8 **)((long)local_280 + (lVar22 * 4 + lVar30 * 2 + -0xe) * 2 + 0x1c) =
             puVar29 + (CONCAT11(*puVar1,puVar1[1]) & uVar12);
        iVar14 = iVar14 + 1;
        local_148._0_4_ = iVar14;
        lVar30 = lVar30 + 2;
      } while (puVar1 + 2 < puVar29 + (ulong)uVar5 * 2 + (ulong)uVar13);
    }
    *(int *)((long)local_168 + (long)local_2b8 * 4) = iVar14;
    uVar40 = local_2a8;
    if ((local_2b8 < local_1e8) && ((char)local_298 == '\0')) {
      uVar32 = *(uint *)((long)local_228 + ((long)local_2b8 + 1) * 4 + 0x1c);
      uVar35 = uVar32 & 0xffff;
      lVar22 = (long)iVar14;
      *(short *)((long)local_250 + (lVar22 + -0xe) * 2 + 0x1c) = (short)uVar32;
      __dest = (void *)(local_170 + (long)(int)local_2a8);
      local_2a8 = (ulong)((int)local_2a8 + uVar35);
      memcpy(__dest,(void *)alStack_88[(long)local_2b8],(ulong)uVar35);
      puVar42 = (undefined4 *)((long)__dest + (long)local_1c8);
      *(undefined4 **)((long)local_280 + (lVar22 * 4 + -0xe) * 2 + 0x1c) = puVar42;
      uVar12 = *(short *)((long)ppMVar23 + (lVar22 + -0xe) * 2 + 0x1c) - (short)local_1c8;
      *(ushort *)((long)ppMVar23 + (lVar22 + -0xe) * 2 + 0x1c) = uVar12;
      uVar40 = local_2a8;
      if (pMVar31->leaf == '\0') {
        *puVar42 = *(undefined4 *)(pMVar31->aData + 8);
      }
      else if (uVar12 < 4) {
        puVar18 = (undefined1 *)((long)(int)local_2a8 + local_188);
        do {
          *puVar18 = 0;
          uVar12 = *(short *)((long)ppMVar23 + (lVar22 + -0xe) * 2 + 0x1c) + 1;
          *(ushort *)((long)ppMVar23 + (lVar22 + -0xe) * 2 + 0x1c) = uVar12;
          puVar18 = puVar18 + 1;
          uVar40 = (ulong)((int)uVar40 + 1);
        } while (uVar12 < 4);
      }
      iVar14 = iVar14 + 1;
      local_148._0_4_ = iVar14;
    }
    ppMVar27 = (MemPage **)((long)ppMVar27 + 1);
    if (ppMVar27 == (MemPage **)local_2b0) break;
LAB_001480b1:
    pMVar31 = local_228[(long)ppMVar27];
    puVar29 = pMVar31->aData;
    if (*puVar29 != *local_b0->aData) {
      uVar32 = 0;
      uVar21 = 0x124ab;
      goto LAB_00148811;
    }
    local_268 = (ulong)pMVar31->nCell;
    uVar12 = pMVar31->maskPage;
    puVar41 = puVar29 + pMVar31->cellOffset;
    lVar22 = (long)iVar14;
    local_2b8 = ppMVar27;
    local_2a8 = uVar40;
    memset((void *)((long)ppMVar23 + (lVar22 + -0xe) * 2 + 0x1c),0,
           (ulong)(((uint)pMVar31->nCell + (uint)pMVar31->nOverflow) * 2));
    ppMVar23 = local_250;
    ppMVar27 = local_2b8;
    bVar3 = pMVar31->nOverflow;
    if ((ulong)bVar3 != 0) {
      uVar13 = pMVar31->aiOvfl[0];
      if ((ushort)local_268 < uVar13) {
        uVar32 = 0;
        uVar21 = 0x124c3;
        goto LAB_00148811;
      }
      if (uVar13 != 0) {
        lVar30 = lVar22 << 0x20;
        lVar33 = 0;
        do {
          *(u8 **)((long)local_280 + (lVar22 * 4 + lVar33 * 2 + -0xe) * 2 + 0x1c) =
               puVar29 + (uVar12 & CONCAT11(puVar41[lVar33],puVar41[lVar33 + 1]));
          lVar30 = lVar30 + 0x100000000;
          lVar33 = lVar33 + 2;
        } while ((uint)uVar13 * 2 != (int)lVar33);
        lVar22 = lVar30 >> 0x20;
        puVar41 = puVar41 + lVar33;
      }
      uVar40 = 0;
      do {
        *(u8 **)((long)local_280 + ((lVar22 + uVar40) * 4 + -0xe) * 2 + 0x1c) =
             pMVar31->apOvfl[uVar40];
        uVar40 = uVar40 + 1;
      } while (bVar3 != uVar40);
      iVar14 = (int)lVar22 + (int)uVar40;
      local_148._0_4_ = iVar14;
    }
  }
  local_170 = (ulong)local_1c8 & 0xffff;
  local_2a8 = CONCAT44(local_2a8._4_4_,local_288->usableSize + (uint)(ushort)local_1c8 + -0xc);
  lVar22 = 0;
  iVar14 = 0;
  do {
    lVar30 = *(long *)((long)local_228 + (lVar22 * 4 + -0xe) * 2 + 0x1c);
    lVar33 = (long)iVar14;
    *(undefined8 *)(local_148 + lVar33 * 8 + 0x20) = *(undefined8 *)(lVar30 + 0x58);
    uVar32 = *(uint *)((long)local_168 + lVar22 * 4);
    *(uint *)((long)&local_f8 + lVar33 * 4) = uVar32;
    iVar16 = 0;
    if ((iVar14 != 0) &&
       (iVar16 = iVar14 + -1, uVar32 != *(uint *)((long)&local_f8 + (lVar33 + -1) * 4))) {
      iVar16 = iVar14;
    }
    if ((uint)local_298 == 0) {
      lVar33 = (long)iVar16;
      iVar16 = iVar16 + 1;
      *(u8 **)(local_148 + (lVar33 + 1) * 8 + 0x20) = local_260->aDataEnd;
      *(uint *)((long)&local_f8 + (lVar33 + 1) * 4) = uVar32 + 1;
    }
    iVar14 = (int)local_2a8 - *(int *)(lVar30 + 0x14);
    *(int *)((long)local_228 + (lVar22 * 2 + 2) * 2 + 0x1c) = iVar14;
    if (*(char *)(lVar30 + 0xc) != '\0') {
      uVar40 = 0;
      do {
        uVar12 = (**(code **)(lVar30 + 0x78))(lVar30,*(undefined8 *)(lVar30 + 0x28 + uVar40 * 8));
        iVar14 = iVar14 + (uint)uVar12 + 2;
        *(int *)((long)local_228 + (lVar22 * 2 + 2) * 2 + 0x1c) = iVar14;
        uVar40 = uVar40 + 1;
      } while (uVar40 < *(byte *)(lVar30 + 0xc));
    }
    local_244[lVar22 + -1] = uVar32;
    lVar22 = lVar22 + 1;
    iVar14 = iVar16 + 1;
  } while ((uint *)lVar22 != local_2b0);
  local_2b0 = (uint *)CONCAT44(local_2b0._4_4_,local_148._0_4_);
  local_250 = (MemPage **)(long)(int)local_148._0_4_;
  local_268 = -(long)local_250;
  uVar34 = (ulong)local_270;
  local_2b8 = (MemPage **)local_148._24_8_;
  ppMVar23 = (MemPage **)local_148._24_8_;
  uVar40 = 0;
  do {
    iVar14 = *(int *)((long)local_228 + (uVar40 * 2 + 2) * 2 + 0x1c);
    if ((int)local_2a8 < iVar14) {
      local_280 = (MemPage **)CONCAT44(local_280._4_4_,(int)uVar40 + 2);
      do {
        if ((long)(int)uVar34 <= (long)(uVar40 + 1)) {
          if (3 < uVar40) {
            *(int *)((long)local_228 + (uVar40 * 2 + 2) * 2 + 0x1c) = iVar14;
            uVar32 = 0;
            uVar21 = 0x12528;
            goto LAB_00148811;
          }
          *(undefined4 *)((long)local_228 + uVar40 * 4 + 0x24) = 0;
          local_244[uVar40] = (uint)local_2b0;
          uVar34 = (ulong)local_280 & 0xffffffff;
        }
        uVar32 = local_244[uVar40 - 1];
        lVar22 = (long)(int)uVar32;
        uVar25 = lVar22 - 1;
        uVar12 = *(ushort *)((long)ppMVar23 + (lVar22 + -0xf) * 2 + 0x1c);
        if (uVar12 == 0) {
          uVar12 = computeCellSize((CellArray *)(local_168 + 4),(uint)uVar25);
          ppMVar23 = local_2b8;
        }
        iVar16 = uVar12 + 2;
        if ((uint)local_298 == 0) {
          iVar16 = 0;
          if ((int)uVar32 < (int)(uint)local_2b0) {
            uVar13 = *(ushort *)((long)ppMVar23 + (lVar22 + -0xe) * 2 + 0x1c);
            if (uVar13 == 0) {
              uVar13 = computeCellSize((CellArray *)(local_168 + 4),uVar32);
              ppMVar23 = local_2b8;
            }
            iVar16 = uVar13 + 2;
          }
        }
        piVar2 = (int *)((long)local_228 + uVar40 * 4 + 0x24);
        *piVar2 = *piVar2 + iVar16;
        iVar14 = iVar14 - (uVar12 + 2);
        local_244[uVar40 - 1] = (uint)uVar25;
      } while ((int)local_2a8 < iVar14);
    }
    else {
      uVar25 = (ulong)local_244[uVar40 - 1];
    }
    uVar26 = uVar40 + 1;
    *(int *)((long)local_228 + (uVar40 * 2 + 2) * 2 + 0x1c) = iVar14;
    if ((int)uVar25 < (int)(uint)local_2b0) {
      lVar22 = (long)(int)uVar25;
      do {
        lVar30 = lVar22 + 1;
        uVar12 = *(ushort *)((long)ppMVar23 + (lVar22 + -0xe) * 2 + 0x1c);
        iVar16 = (int)uVar25;
        if (uVar12 == 0) {
          uVar12 = computeCellSize((CellArray *)(local_168 + 4),iVar16);
          ppMVar23 = local_2b8;
        }
        iVar14 = iVar14 + (uint)uVar12 + 2;
        if ((int)local_2a8 < iVar14) {
          if (uVar40 == 0) {
            iVar14 = 0;
          }
          else {
            iVar14 = *(int *)((long)&local_250 + uVar40 * 4 + 4);
          }
          if (iVar14 < iVar16) goto LAB_001485df;
          uVar32 = 0;
          uVar21 = 0x12549;
          goto LAB_00148811;
        }
        uVar32 = iVar16 + 1;
        uVar25 = (ulong)uVar32;
        *(int *)((long)local_228 + (uVar40 * 2 + 2) * 2 + 0x1c) = iVar14;
        local_244[uVar40 - 1] = uVar32;
        if ((uint)local_298 == 0) {
          iVar16 = 0;
          if (lVar30 < (long)local_250) {
            uVar12 = *(ushort *)((long)ppMVar23 + (lVar22 + -0xd) * 2 + 0x1c);
            if (uVar12 == 0) {
              uVar12 = computeCellSize((CellArray *)(local_168 + 4),uVar32);
              ppMVar23 = local_2b8;
            }
            goto LAB_001485a1;
          }
        }
        else {
LAB_001485a1:
          iVar16 = uVar12 + 2;
        }
        piVar2 = (int *)((long)local_228 + uVar40 * 4 + 0x24);
        *piVar2 = *piVar2 - iVar16;
        lVar22 = lVar30;
      } while (local_268 + lVar30 != 0);
    }
    uVar34 = uVar26 & 0xffffffff;
LAB_001485df:
    uVar40 = uVar26;
  } while ((long)uVar26 < (long)(int)uVar34);
  local_188 = uVar34;
  local_1c8 = (MemPage **)(ulong)((int)uVar34 - 1);
  ppMVar37 = (MemPage **)((long)ppMVar23 - (ulong)(uint)((int)local_298 * 2));
  ppMVar27 = local_1c8;
  PVar39 = (uint)local_2a0;
  local_280 = ppMVar37;
  do {
    if ((int)ppMVar27 < 1) {
      local_2b8 = (MemPage **)CONCAT44(local_2b8._4_4_,(uint)*local_b0->aData);
      if ((int)local_188 < 1) {
        uVar32 = 0;
        local_278 = (MemPage **)((ulong)local_278 & 0xffffffff00000000);
        goto LAB_00148d41;
      }
      local_278 = (MemPage **)(ulong)(uint)((int)local_278 - (int)local_258);
      uVar40 = local_188 & 0xffffffff;
      ppMVar23 = (MemPage **)0x0;
      uVar35 = 0;
      goto LAB_00148ab8;
    }
    iVar14 = *(int *)((long)local_228 + (long)ppMVar27 * 4 + 0x1c);
    iVar16 = *(int *)((long)local_228 + ((long)ppMVar27 + 1) * 4 + 0x1c);
    uVar32 = *(uint *)((long)&local_250 + (long)ppMVar27 * 4 + 4);
    lVar22 = (long)(int)uVar32 - local_298;
    if (*(short *)((long)ppMVar23 + lVar22 * 2) == 0) {
      computeCellSize((CellArray *)(local_168 + 4),(int)lVar22);
      ppMVar23 = local_2b8;
      ppMVar37 = local_280;
    }
    local_268 = (ulong)((uint)(ppMVar27 == local_1c8) * 2 - 2);
    lVar22 = (long)(int)uVar32 + 1;
    local_250 = ppMVar27;
    do {
      uVar35 = uVar32 - 1;
      if (*(short *)((long)ppMVar23 + (lVar22 + -0x10) * 2 + 0x1c) == 0) {
        computeCellSize((CellArray *)(local_168 + 4),uVar35);
        ppMVar23 = local_2b8;
        ppMVar37 = local_280;
      }
      if (iVar16 == 0) {
        uVar12 = *(ushort *)((long)ppMVar23 + (lVar22 + -0x10) * 2 + 0x1c);
        iVar15 = *(ushort *)((long)ppMVar37 + (lVar22 + -0xf) * 2 + 0x1c) + 2;
      }
      else {
        if ((char)local_b8 != '\0') break;
        iVar15 = (uint)*(ushort *)((long)ppMVar37 + (lVar22 + -0xf) * 2 + 0x1c) + iVar16 + 2;
        uVar12 = *(ushort *)((long)ppMVar23 + (lVar22 + -0x10) * 2 + 0x1c);
        if ((int)(((int)local_268 + iVar14) - (uint)uVar12) < iVar15) break;
      }
      iVar14 = (iVar14 - (uint)uVar12) + -2;
      local_244[(long)ppMVar27 + -2] = uVar35;
      lVar22 = lVar22 + -1;
      uVar32 = uVar35;
      iVar16 = iVar15;
    } while (1 < lVar22);
    *(int *)((long)local_228 + ((long)local_250 + 1) * 4 + 0x1c) = iVar16;
    *(int *)((long)local_228 + (long)ppMVar27 * 4 + 0x1c) = iVar14;
    uVar35 = 0;
    if (local_250 != (MemPage **)0x1) {
      uVar35 = local_244[(ulong)((int)local_250 - 2) - 1];
    }
    ppMVar27 = (MemPage **)((long)ppMVar27 + -1);
    PVar39 = (uint)local_2a0;
  } while ((int)uVar35 < (int)uVar32);
  uVar21 = 0x12573;
  uVar32 = 0;
LAB_00148811:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar21);
  iVar15 = 0xb;
  goto LAB_0014881f;
LAB_00148ab8:
  do {
    pBVar20 = local_288;
    if (local_1e8 < ppMVar23) {
      PVar39 = 1;
      if ((char)local_b8 == '\0') {
        PVar39 = local_26c;
      }
      iVar15 = allocateBtreePage(local_288,(MemPage **)&local_d8,&local_26c,PVar39,'\0');
      uVar32 = uVar35;
      local_2bc = iVar15;
      if (iVar15 != 0) goto LAB_0014881f;
      pMVar31 = (MemPage *)CONCAT44(local_d8.nKey._4_4_,(int)local_d8.nKey);
      zeroPage(pMVar31,(int)local_2b8);
      local_228[(long)(ppMVar23 + -1) + 0x16] = pMVar31;
      *(uint *)((long)local_168 + (long)ppMVar23 * 4) = (uint)local_2b0;
      if (pBVar20->autoVacuum != '\0') {
        ptrmapPut(pBVar20,pMVar31->pgno,'\x05',local_260->pgno,&local_2bc);
        iVar15 = local_2bc;
        goto joined_r0x00148bb4;
      }
    }
    else {
      pMVar31 = local_228[(long)ppMVar23];
      local_228[(long)(ppMVar23 + -1) + 0x16] = pMVar31;
      local_228[(long)ppMVar23] = (MemPage *)0x0;
      local_2bc = sqlite3PagerWrite(pMVar31->pDbPage);
      uVar32 = uVar35 + 1;
      iVar15 = local_2bc;
      if (((local_278 == ppMVar23) + 1 != (int)pMVar31->pDbPage->nRef) && (local_2bc == 0)) {
        uVar21 = 0x12594;
        goto LAB_00148811;
      }
joined_r0x00148bb4:
      uVar32 = uVar35 + 1;
      local_2bc = iVar15;
      if (iVar15 != 0) goto LAB_0014881f;
    }
    uVar35 = uVar35 + 1;
    ppMVar23 = (MemPage **)((long)ppMVar23 + 1);
  } while ((MemPage **)uVar40 != ppMVar23);
  uVar32 = uVar35;
  if ((int)uVar35 < 1) {
    local_278 = (MemPage **)((ulong)local_278 & 0xffffffff00000000);
    PVar39 = local_26c;
  }
  else {
    uVar34 = (ulong)uVar35;
    uVar40 = 0;
    do {
      pMVar31 = local_228[uVar40 + 0xe];
      PVar39 = pMVar31->pgno;
      aPStack_68[uVar40] = PVar39;
      (&PStack_a8)[uVar40] = PVar39;
      auStack_72[uVar40] = pMVar31->pDbPage->flags;
      if (uVar40 != 0) {
        uVar25 = 0;
        do {
          if (aPStack_68[uVar25] == PVar39) {
            uVar21 = 0x125c2;
            goto LAB_00148811;
          }
          uVar25 = uVar25 + 1;
        } while (uVar40 != uVar25);
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != uVar34);
    uVar40 = 0;
    do {
      uVar25 = 0;
      if (uVar35 != 1) {
        uVar19 = 1;
        uVar26 = 0;
        do {
          uVar25 = uVar19 & 0xffffffff;
          if ((&PStack_a8)[(int)uVar26] <= (&PStack_a8)[uVar19]) {
            uVar25 = uVar26;
          }
          uVar19 = uVar19 + 1;
          uVar26 = uVar25;
        } while (uVar34 != uVar19);
      }
      lVar22 = (long)(int)uVar25;
      local_2a0 = (MemPage *)CONCAT44(local_2a0._4_4_,(&PStack_a8)[lVar22]);
      (&PStack_a8)[lVar22] = 0xffffffff;
      if (uVar40 != uVar25) {
        if ((long)uVar40 < lVar22) {
          pPVar7 = local_228[lVar22 + 0xe]->pDbPage;
          uVar6 = local_288->nPage;
          pPVar7->flags = 0;
          sqlite3PcacheMove(pPVar7,(int)uVar25 + uVar6 + 1);
        }
        pMVar31 = local_228[uVar40 + 0xe];
        pPVar7 = pMVar31->pDbPage;
        pPVar7->flags = auStack_72[lVar22];
        PVar39 = (uint)local_2a0;
        sqlite3PcacheMove(pPVar7,(uint)local_2a0);
        pMVar31->pgno = PVar39;
        uVar25 = extraout_RAX;
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != uVar34);
    local_278 = (MemPage **)CONCAT44(local_278._4_4_,(int)CONCAT71((int7)(uVar25 >> 8),1));
    PVar39 = (uint)local_2a0;
  }
LAB_00148d41:
  local_268 = (ulong)(int)uVar32;
  pMVar31 = local_228[local_268 + 0xd];
  uVar35 = pMVar31->pgno;
  *local_178 = uVar35 >> 0x18 | (uVar35 & 0xff0000) >> 8 | (uVar35 & 0xff00) << 8 | uVar35 << 0x18;
  if ((((ulong)local_2b8 & 8) == 0) && (local_270 != uVar32)) {
    ppMVar23 = local_228;
    if ((int)local_270 < (int)uVar32) {
      ppMVar23 = local_228 + 0xe;
    }
    *(undefined4 *)(pMVar31->aData + 8) =
         *(undefined4 *)
          (*(long *)(*(long *)((long)ppMVar23 + ((long)local_1e8 * 4 + -0xe) * 2 + 0x1c) + 0x50) + 8
          );
  }
  local_26c = PVar39;
  if (0 < (int)(uint)local_2b0 && local_288->autoVacuum != '\0') {
    bVar43 = (uint)local_298 == 0;
    pMVar31 = (MemPage *)CONCAT44(local_1b8._4_4_,(int)local_1b8);
    uVar34 = (ulong)((uint)pMVar31->nCell + (uint)pMVar31->nOverflow);
    uVar40 = 0;
    iVar14 = 0;
    local_2b8 = (MemPage **)((ulong)local_2b8 & 0xffffffff00000000);
    pMVar38 = pMVar31;
    do {
      if (uVar40 == uVar34) {
        lVar22 = (long)iVar14;
        ppMVar23 = (MemPage **)((long)local_228 + (lVar22 * 4 + -10) * 2 + 0x1c);
        ppMVar27 = local_228 + lVar22 + 0xf;
        do {
          lVar22 = lVar22 + 1;
          ppMVar37 = ppMVar23;
          if (lVar22 < (long)local_268) {
            ppMVar37 = ppMVar27;
          }
          pMVar31 = *ppMVar37;
          uVar34 = (ulong)((int)uVar34 + (uint)bVar43 + (uint)pMVar31->nCell +
                          (uint)pMVar31->nOverflow);
          iVar14 = iVar14 + 1;
          ppMVar23 = ppMVar23 + 1;
          ppMVar27 = ppMVar27 + 1;
        } while (uVar40 == uVar34);
      }
      puVar28 = *(uint **)(local_148._16_8_ + (uVar40 * 4 + -0xe) * 2 + 0x1c);
      lVar22 = (long)(int)local_2b8;
      if (uVar40 == local_244[lVar22 + -1]) {
        local_2b8 = (MemPage **)CONCAT44(local_2b8._4_4_,(int)local_2b8 + 1);
        pMVar38 = local_228[lVar22 + 0xf];
        if ((uint)local_298 != 0) goto LAB_00148e6b;
LAB_00148e8c:
        iVar16 = (uint)local_2b0;
      }
      else {
LAB_00148e6b:
        if ((((iVar14 < (int)uVar32) && (pMVar38->pgno == aPStack_68[iVar14])) &&
            (pMVar31->aData <= puVar28)) && (puVar28 < pMVar31->aDataEnd)) goto LAB_00148e8c;
        local_2a0 = pMVar38;
        if ((char)local_1cc == '\0') {
          uVar35 = *puVar28;
          local_2b0 = puVar28;
          ptrmapPut(local_288,
                    uVar35 >> 0x18 | (uVar35 & 0xff0000) >> 8 | (uVar35 & 0xff00) << 8 |
                    uVar35 << 0x18,'\x05',pMVar38->pgno,&local_2bc);
          puVar28 = local_2b0;
        }
        uVar12 = *(ushort *)(local_148._24_8_ + (uVar40 - 0xe) * 2 + 0x1c);
        if (uVar12 == 0) {
          local_2b0 = puVar28;
          uVar12 = computeCellSize((CellArray *)(local_168 + 4),(int)uVar40);
          puVar28 = local_2b0;
        }
        if (local_2a0->minLocal < uVar12) {
          ptrmapPutOvflPtr(local_2a0,pMVar31,(u8 *)puVar28,&local_2bc);
        }
        iVar15 = local_2bc;
        if (local_2bc != 0) goto LAB_0014881f;
        pMVar38 = local_2a0;
        iVar16 = local_148._0_4_;
      }
      uVar40 = uVar40 + 1;
      local_2b0 = (uint *)CONCAT44(local_2b0._4_4_,iVar16);
    } while ((long)uVar40 < (long)iVar16);
  }
  if (1 < (int)uVar32) {
    local_2b8 = (MemPage **)local_148._16_8_;
    local_280 = (MemPage **)local_148._24_8_;
    local_1e8 = (MemPage **)(ulong)(uVar32 - 1);
    lVar22 = 0;
    iVar14 = 0;
    do {
      local_2a0 = local_228[lVar22 + 0xe];
      uVar35 = local_244[lVar22 + -1];
      lVar30 = (long)(int)uVar35;
      puVar29 = *(u8 **)((long)local_2b8 + (lVar30 * 4 + -0xe) * 2 + 0x1c);
      uVar12 = *(ushort *)((long)local_280 + (lVar30 + -0xe) * 2 + 0x1c);
      uVar24 = (int)local_170 + (uint)uVar12;
      puVar41 = (u8 *)((long)local_1d8 + (long)iVar14);
      if (local_2a0->leaf == '\0') {
        *(undefined4 *)(local_2a0->aData + 8) = *(undefined4 *)puVar29;
      }
      else if ((uint)local_298 == 0) {
        puVar29 = puVar29 + -4;
        if (uVar12 == 4) {
          uVar11 = (*local_260->xCellSize)(local_260,puVar29);
          uVar24 = (uint)uVar11;
        }
      }
      else {
        uVar35 = uVar35 - 1;
        (*local_2a0->xParseCell)
                  (local_2a0,*(u8 **)((long)local_2b8 + (lVar30 * 4 + -0x12) * 2 + 0x1c),&local_d8);
        iVar16 = sqlite3PutVarint(puVar41 + 4,CONCAT44(local_d8.nKey._4_4_,(int)local_d8.nKey));
        uVar24 = iVar16 + 4;
        puVar29 = puVar41;
        puVar41 = (u8 *)0x0;
      }
      uVar40 = 0;
      do {
        uVar34 = uVar40;
        if (5 < uVar34) break;
        uVar40 = uVar34 + 1;
      } while (*(int *)((long)&local_f8 + uVar34 * 4) <= (int)uVar35);
      if ((puVar29 <= *(u8 **)(local_148 + uVar34 * 8 + 0x20)) &&
         (*(u8 **)(local_148 + uVar34 * 8 + 0x20) < puVar29 + (int)uVar24)) {
        uVar21 = 0x1265f;
        goto LAB_00148811;
      }
      insertCell(local_260,(int)local_258 + (int)lVar22,puVar29,uVar24,puVar41,local_2a0->pgno,
                 &local_2bc);
      iVar15 = local_2bc;
      if (local_2bc != 0) goto LAB_0014881f;
      iVar14 = iVar14 + uVar24;
      lVar22 = lVar22 + 1;
    } while ((MemPage **)lVar22 != local_1e8);
  }
  uVar35 = 1 - uVar32;
  pBVar20 = local_288;
  if ((int)uVar35 < (int)uVar32) {
    uVar24 = (uint)((uint)local_298 == 0);
    local_2a0 = (MemPage *)CONCAT44(local_2a0._4_4_,local_248);
    iVar14 = uVar32 * 2 + -1;
    local_298 = CONCAT44(local_298._4_4_,(uint)((uint)local_298 == 0));
    do {
      uVar8 = -uVar35;
      if (0 < (int)uVar35) {
        uVar8 = uVar35;
      }
      uVar40 = (ulong)uVar8;
      if (*(char *)((long)local_228 + uVar40 + 0x38) == '\0') {
        if ((int)uVar35 < 0) {
          pBVar20 = local_288;
          if (*(int *)((long)&local_250 + (long)(int)uVar8 * 4 + 4) <=
              *(int *)((long)local_168 + ((long)(int)uVar8 + -1) * 4)) goto LAB_00149136;
        }
        else {
          if (uVar35 == 0) {
            iNew = 0;
            iVar16 = 0;
            iVar15 = (uint)local_2a0;
          }
          else {
LAB_00149136:
            if ((uint)local_180 < uVar8) {
              uVar34 = (ulong)(uVar8 - 1);
              iVar16 = (uint)local_2b0;
            }
            else {
              uVar34 = (ulong)(int)(uVar8 - 1);
              iVar16 = *(int *)((long)local_168 + uVar34 * 4) + uVar24;
            }
            iNew = local_244[uVar34 - 1] + uVar24;
            iVar15 = local_244[uVar40 - 1] - iNew;
          }
          pMVar31 = local_228[uVar40 + 0xe];
          iVar15 = editPage(pMVar31,iVar16,iNew,iVar15,(CellArray *)(local_168 + 4));
          if (iVar15 != 0) goto LAB_0014881f;
          *(undefined1 *)((long)local_228 + uVar40 + 0x38) = 1;
          pMVar31->nFree = (int)local_2a8 - *(int *)((long)local_228 + (uVar40 * 2 + 2) * 2 + 0x1c);
          pBVar20 = local_288;
          uVar24 = (uint)local_298;
        }
      }
      uVar35 = uVar35 + 1;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  pMVar31 = local_260;
  pBt = local_288;
  local_2bc = 0;
  if (((local_289 == '\x01') && (local_260->nCell == 0)) &&
     (pMVar38 = (MemPage *)CONCAT44(local_1b8._4_4_,(int)local_1b8), pBVar20 = local_288,
     (int)(uint)local_260->hdrOffset <= pMVar38->nFree)) {
    local_2bc = defragmentPage(pMVar38,-1);
    copyNodeContent(pMVar38,pMVar31,&local_2bc);
    iVar14 = (int)local_180;
    iVar15 = local_2bc;
    if (local_2bc == 0) {
      iVar15 = freePage2(pMVar38->pBt,pMVar38,pMVar38->pgno);
    }
  }
  else {
    iVar14 = (int)local_180;
    iVar15 = 0;
    if (((byte)local_278 & (char)local_1cc == '\0' & pBVar20->autoVacuum != '\0') == 1) {
      uVar40 = 0;
      do {
        uVar35 = *(uint *)(local_228[uVar40 + 0xe]->aData + 8);
        ptrmapPut(pBt,uVar35 >> 0x18 | (uVar35 & 0xff0000) >> 8 | (uVar35 & 0xff00) << 8 |
                      uVar35 << 0x18,'\x05',local_228[uVar40 + 0xe]->pgno,&local_2bc);
        uVar40 = uVar40 + 1;
        iVar15 = local_2bc;
      } while (uVar32 != uVar40);
    }
  }
  uVar40 = local_268;
  if ((int)uVar32 <= iVar14) {
    lVar22 = 0;
    do {
      if (iVar15 == 0) {
        pMVar31 = *(MemPage **)((long)local_228 + (lVar22 * 4 + uVar40 * 4 + -0xe) * 2 + 0x1c);
        iVar15 = freePage2(pMVar31->pBt,pMVar31,pMVar31->pgno);
      }
      lVar22 = lVar22 + 1;
    } while ((iVar14 - uVar32) + 1 != (int)lVar22);
  }
LAB_0014881f:
  if ((MemPage **)local_148._16_8_ != (MemPage **)0x0) {
    sqlite3_free((void *)local_148._16_8_);
  }
LAB_00148831:
  uVar34 = (ulong)local_270;
  uVar40 = 0;
  do {
    lVar22 = *(long *)((long)local_228 + (uVar40 * 4 + -0xe) * 2 + 0x1c);
    if (lVar22 != 0) {
      sqlite3PagerUnrefNotNull(*(DbPage **)(lVar22 + 0x70));
    }
    uVar40 = uVar40 + 1;
  } while (uVar34 != uVar40);
  pMVar31 = local_c0;
  pCur = local_1e0;
  if (0 < (int)uVar32) {
    uVar40 = 0;
    do {
      if (local_228[uVar40 + 0xe] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_228[uVar40 + 0xe]->pDbPage);
      }
      uVar40 = uVar40 + 1;
      pMVar31 = local_c0;
      pCur = local_1e0;
    } while (uVar32 != uVar40);
  }
LAB_00148890:
  if (local_1c0 != (void *)0x0) {
    pcache1Free(local_1c0);
  }
  local_1c0 = local_1d8;
LAB_001488b2:
  pMVar31->nOverflow = '\0';
  sqlite3PagerUnrefNotNull(pMVar31->pDbPage);
  cVar10 = pCur->iPage + -1;
  pCur->iPage = cVar10;
  pMVar38 = pCur->apPage[cVar10];
LAB_001488d6:
  pCur->pPage = pMVar38;
  pMVar31 = pMVar38;
  if (iVar15 != 0) {
LAB_001493cf:
    if (local_1c0 != (void *)0x0) {
      pcache1Free(local_1c0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return iVar15;
  }
  goto LAB_0014798c;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( pPage->nOverflow==0 && pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
      /* No rebalance required as long as:
      **   (1) There are no overflow cells
      **   (2) The amount of free space on the page is less than 2/3rds of
      **       the total usable space on the page. */
      break;
    }else if( (iPage = pCur->iPage)==0 ){
      if( pPage->nOverflow && (rc = anotherValidCursor(pCur))==SQLITE_OK ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer.
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 );
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          **
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below.
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot()
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}